

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O1

void __thiscall PathTracerThread::Launch(PathTracerThread *this)

{
  PathTracer *this_00;
  PathTracerViewer *this_01;
  double dVar1;
  code *local_40;
  element_type *local_38;
  thread local_30;
  PathTracerThread *local_28;
  
  if ((this->m_viewer_thread)._M_id._M_thread != 0 ||
      (this->m_path_tracer_thread)._M_id._M_thread != 0) {
    return;
  }
  LOCK();
  (this->m_run)._M_base._M_i = true;
  UNLOCK();
  LOCK();
  (this->m_pause)._M_base._M_i = false;
  UNLOCK();
  this->m_spp = 0;
  dVar1 = glfwGetTime();
  this->m_time = dVar1;
  this_00 = (((this->m_path_tracer_viewer_ptr).
              super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  myvk::CommandPool::Create((CommandPool *)&local_40,&this->m_path_tracer_queue,0);
  PathTracer::Reset(this_00,(shared_ptr<myvk::CommandPool> *)&local_40,&this->m_main_queue);
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  this_01 = (this->m_path_tracer_viewer_ptr).
            super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  myvk::CommandPool::Create((CommandPool *)&local_40,&this->m_main_queue,0);
  PathTracerViewer::Reset(this_01,(shared_ptr<myvk::CommandPool> *)&local_40);
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  local_40 = path_tracer_thread_func;
  local_38 = (element_type *)0x0;
  local_28 = this;
  std::thread::thread<void(PathTracerThread::*)(),PathTracerThread*,void>
            (&local_30,(offset_in_PathTracerThread_to_subr *)&local_40,&local_28);
  if ((this->m_path_tracer_thread)._M_id._M_thread == 0) {
    (this->m_path_tracer_thread)._M_id._M_thread = (native_handle_type)local_30._M_id._M_thread;
    local_40 = viewer_thread_func;
    local_38 = (element_type *)0x0;
    local_28 = this;
    std::thread::thread<void(PathTracerThread::*)(),PathTracerThread*,void>
              (&local_30,(offset_in_PathTracerThread_to_subr *)&local_40,&local_28);
    if ((this->m_viewer_thread)._M_id._M_thread == 0) {
      (this->m_viewer_thread)._M_id._M_thread = (native_handle_type)local_30._M_id._M_thread;
      return;
    }
  }
  std::terminate();
}

Assistant:

void PathTracerThread::StopAndJoin() {
	if (!IsRunning())
		return;

	m_pause.store(false, std::memory_order_release);
	m_run.store(false, std::memory_order_release);

	spdlog::debug("m_viewer_semaphore signal");
	m_viewer_semaphore.signal();
	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();

	m_path_tracer_thread.join();
	m_viewer_thread.join();
}